

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

SQInteger __thiscall SQCompiler::ChooseCompArithCharByToken(SQCompiler *this,SQInteger tok)

{
  if (tok < 0x13d) {
    if (tok == 0x121) {
      return 0x2b;
    }
    if (tok == 0x122) {
      return 0x2d;
    }
  }
  else {
    if (tok == 0x13d) {
      return 0x2a;
    }
    if (tok == 0x13e) {
      return 0x2f;
    }
    if (tok == 0x13f) {
      return 0x25;
    }
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqcompiler.cpp"
                ,0x24e,"SQInteger SQCompiler::ChooseCompArithCharByToken(SQInteger)");
}

Assistant:

SQInteger ChooseCompArithCharByToken(SQInteger tok)
    {
        SQInteger oper;
        switch(tok){
        case TK_MINUSEQ: oper = '-'; break;
        case TK_PLUSEQ: oper = '+'; break;
        case TK_MULEQ: oper = '*'; break;
        case TK_DIVEQ: oper = '/'; break;
        case TK_MODEQ: oper = '%'; break;
        default: oper = 0; //shut up compiler
            assert(0); break;
        };
        return oper;
    }